

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-quantize-perf.cpp
# Opt level: O0

void usage(char **argv)

{
  long lVar1;
  long *plVar2;
  long lVar3;
  undefined8 uVar4;
  undefined8 *in_RDI;
  ggml_type_traits_cpu *qfns_cpu;
  ggml_type_traits *qfns;
  ggml_type type;
  int i;
  int local_c;
  
  printf("Benchmark quantization specific functions on synthetic data\n");
  printf("\n");
  printf("usage: %s [options]\n",*in_RDI);
  printf("\n");
  printf("options: (default)\n");
  printf("  -h, --help            show this help message and exit\n");
  printf("  --size SIZE           set test size, divisible by 32 (L1_SIZE:%d)\n",0x1000);
  printf("  -3                    use size as L1, L2, L3 sizes (L1:%d L2:%d L3:%d)\n",0x1000,0x10000
         ,0xa0000);
  printf("  -4                    use size as L1, L2, L3, MEM sizes (L1:%d L2:%d L3:%d MEM:%d)\n",
         0x1000,0x10000,0xa0000,0x3e80000);
  printf(
        "  --op OP               set test operation as quantize_row_q_reference, quantize_row_q, dequantize_row_q,\n"
        );
  printf("                        quantize_row_q_dot, vec_dot_q (all)\n");
  printf("  --type TYPE           set test type as");
  for (local_c = 0; local_c < 0x27; local_c = local_c + 1) {
    lVar1 = ggml_get_type_traits(local_c);
    plVar2 = (long *)ggml_get_type_traits_cpu(local_c);
    lVar3 = ggml_type_name(local_c);
    if (((lVar3 != 0) && (*plVar2 != 0)) && (*(long *)(lVar1 + 0x28) != 0)) {
      uVar4 = ggml_type_name(local_c);
      printf(" %s",uVar4);
    }
  }
  printf(" (all)\n");
  printf("  --alignment-offset OFFSET\n");
  printf("                        set alignment offset as OFFSET (0)\n");
  printf("  -i NUM, --iterations NUM\n");
  printf("                        set test iteration number (%d)\n",10);
  return;
}

Assistant:

static void usage(char * argv[]) {
    printf("Benchmark quantization specific functions on synthetic data\n");
    printf("\n");
    printf("usage: %s [options]\n", argv[0]);
    printf("\n");
    printf("options: (default)\n");
    printf("  -h, --help            show this help message and exit\n");
    printf("  --size SIZE           set test size, divisible by 32 (L1_SIZE:%d)\n", L1_SIZE);
    printf("  -3                    use size as L1, L2, L3 sizes (L1:%d L2:%d L3:%d)\n", L1_SIZE, L2_SIZE, L3_SIZE);
    printf("  -4                    use size as L1, L2, L3, MEM sizes (L1:%d L2:%d L3:%d MEM:%d)\n", L1_SIZE, L2_SIZE, L3_SIZE, MEM_SIZE);
    printf("  --op OP               set test operation as quantize_row_q_reference, quantize_row_q, dequantize_row_q,\n");
    printf("                        quantize_row_q_dot, vec_dot_q (all)\n");
    printf("  --type TYPE           set test type as");
    for (int i = 0; i < GGML_TYPE_COUNT; i++) {
        ggml_type type = (ggml_type) i;
        const auto * qfns     = ggml_get_type_traits(type);
        const auto * qfns_cpu = ggml_get_type_traits_cpu(type);
        if (ggml_type_name(type) != NULL) {
            if (qfns_cpu->from_float && qfns->to_float) {
                printf(" %s", ggml_type_name(type));
            }
        }
    }
    printf(" (all)\n");
    printf("  --alignment-offset OFFSET\n");
    printf("                        set alignment offset as OFFSET (0)\n");
    printf("  -i NUM, --iterations NUM\n");
    printf("                        set test iteration number (%d)\n", ITERATIONS);
}